

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O1

size_t __thiscall pb::TestFeatures::ByteSizeLong(TestFeatures *this)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  
  uVar1 = *(uint *)&this->field_0;
  sVar4 = (size_t)(uVar1 >> 9 & 2);
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      uVar3 = (long)(this->field_0)._impl_.file_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 2) != 0) {
      uVar3 = (long)(this->field_0)._impl_.extension_range_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 4) != 0) {
      uVar3 = (long)(this->field_0)._impl_.message_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 8) != 0) {
      uVar3 = (long)(this->field_0)._impl_.field_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 0x10) != 0) {
      uVar3 = (long)(this->field_0)._impl_.oneof_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 0x20) != 0) {
      uVar3 = (long)(this->field_0)._impl_.enum_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 0x40) != 0) {
      uVar3 = (long)(this->field_0)._impl_.enum_entry_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((char)uVar1 < '\0') {
      uVar3 = (long)(this->field_0)._impl_.service_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  if ((uVar1 & 0xfb00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      uVar3 = (long)(this->field_0)._impl_.method_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      uVar3 = (long)(this->field_0)._impl_.multiple_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      uVar3 = (long)(this->field_0)._impl_.source_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      uVar3 = (long)(this->field_0)._impl_.source_feature2_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      uVar3 = (long)(this->field_0)._impl_.removed_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      uVar3 = (long)(this->field_0)._impl_.future_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((short)uVar1 < 0) {
      uVar3 = (long)(this->field_0)._impl_.legacy_feature_ | 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    uVar3 = (long)(this->field_0)._impl_.value_lifetime_feature_ | 1;
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

PROTOBUF_ALWAYS_INLINE void PrefetchLine(const void* ptr, size_t line) {
  static_assert(kOpts.from.unit == PrefetchOpts::kBytes);
  const ptrdiff_t offset = kOpts.from.num + (line * ABSL_CACHELINE_SIZE);
  // Pointer + offset overflows don't matter for prefetching, because the
  // prefetch instruction is just a no-op for invalid addresses (although
  // potentially incurring the cost of a TLB page-walk if there's no valid
  // mapping for the page - but that should be rare in practice). Still, to
  // formally avoid UB, we perform the arithmetic in uintptr_t space.
  const void* prefetch_ptr =
      reinterpret_cast<const void*>(reinterpret_cast<uintptr_t>(ptr) + offset);
  __builtin_prefetch(prefetch_ptr, kOpts.mem_op, kOpts.locality);
}